

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

void PrepareResponseForGet<int>
               (CMConnection conn,Remote_evpath_state *ev_state,GetRequestMsg *GetMsg,
               string *VarName,DataType TypeOfVar,AnonADIOSFile *f)

{
  Variable *pVVar1;
  GetRequestMsg p_Var2;
  ostream *poVar3;
  unsigned_long *puVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  CMFormat *__args_1;
  bool local_b1;
  Remote_evpath_state *local_b0;
  thread local_a8;
  AnonADIOSFile *f_local;
  Box<Dims> b;
  int *RawData;
  size_t readSize;
  CMConnection conn_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_b0 = ev_state;
  f_local = f;
  conn_local = conn;
  pVVar1 = adios2::core::IO::InquireVariable<int>((string *)f->m_io);
  if (f_local->m_mode == RemoteOpenRandomAccess) {
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(*GetMsg)->Step;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(*GetMsg)->StepCount;
    adios2::core::VariableBase::SetStepSelection((pair *)pVVar1);
  }
  if ((*GetMsg)->BlockID != -1) {
    adios2::core::VariableBase::SetBlockSelection((ulong)pVVar1);
  }
  if ((*GetMsg)->Start != (size_t *)0x0) {
    b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (((*GetMsg)->Count != (size_t *)0x0) && (p_Var2 = *GetMsg, 0 < p_Var2->DimCount)) {
      lVar5 = 0;
      lVar7 = 0;
      do {
        puVar4 = (unsigned_long *)((long)p_Var2->Start + lVar5);
        if (b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&b,
                     (iterator)
                     b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,puVar4);
        }
        else {
          *b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = *puVar4;
          b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        puVar4 = (unsigned_long *)((long)(*GetMsg)->Count + lVar5);
        if (b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&b.second,
                     (iterator)
                     b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,puVar4);
        }
        else {
          *b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = *puVar4;
          b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar7 = lVar7 + 1;
        p_Var2 = *GetMsg;
        lVar5 = lVar5 + 8;
      } while (lVar7 < p_Var2->DimCount);
    }
    adios2::core::VariableBase::SetSelection((pair *)pVVar1);
    if (b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading var ",0xc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(VarName->_M_dataplus)._M_p,VarName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with ",6);
  pcVar6 = "relative";
  if ((*GetMsg)->Relative == '\0') {
    pcVar6 = "absolute";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," error ",7);
  poVar3 = std::ostream::_M_insert<double>((*GetMsg)->Error);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," in norm ",9);
  poVar3 = std::ostream::_M_insert<double>((*GetMsg)->Norm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar5 = adios2::core::Variable<int>::SelectionSize();
  readSize = lVar5 * 4;
  RawData = (int *)malloc(readSize);
  adios2::core::Engine::Get<int>((Variable *)f_local->m_engine,(int *)pVVar1,(Mode)RawData);
  WaitForAvailableThread();
  p_Var2 = *GetMsg;
  b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)p_Var2->Error;
  b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)p_Var2->Norm;
  b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT71(b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                         p_Var2->Relative != '\0');
  __args_1 = &local_b0->ReadResponseFormat;
  local_b0 = (Remote_evpath_state *)&p_Var2->Dest;
  adios2::core::Variable<int>::Count();
  local_b1 = *(int *)(pVVar1 + 0x50) == 0;
  std::thread::
  thread<void(&)(_CMConnection*,_CMFormat*,AnonADIOSFile*,unsigned_long,int*,void*,int,adios2::Accuracy,std::__cxx11::string,adios2::DataType,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,unsigned_long,bool),_CMConnection*&,_CMFormat*&,AnonADIOSFile*&,unsigned_long&,int*&,void*&,int&,adios2::Accuracy&,std::__cxx11::string_const&,adios2::DataType_const&,unsigned_long&,unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&,unsigned_long&,bool,void>
            (&local_a8,ReturnResponseThread<int>,&conn_local,__args_1,&f_local,&readSize,&RawData,
             &local_b0->cm,&p_Var2->GetResponseCondition,(Accuracy *)&b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pVVar1 + 8),
             (DataType *)(pVVar1 + 0x28),(unsigned_long *)(pVVar1 + 0x100),
             (unsigned_long *)(pVVar1 + 0x108),&local_48,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pVVar1 + 0x70),
             (unsigned_long *)(pVVar1 + 0x48),&local_b1);
  std::thread::detach();
  if (local_a8._M_id._M_thread == 0) {
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  std::terminate();
}

Assistant:

void PrepareResponseForGet(CMConnection conn, struct Remote_evpath_state *ev_state,
                           GetRequestMsg &GetMsg, std::string &VarName, adios2::DataType TypeOfVar,
                           AnonADIOSFile *f)
{
    // This part cannot be threaded as ADIOS InquireVariable/Get are not thread-safe
    Variable<T> *var = f->m_io->InquireVariable<T>(VarName);
    if (f->m_mode == RemoteOpenRandomAccess)
        var->SetStepSelection({GetMsg->Step, GetMsg->StepCount});
    if (GetMsg->BlockID != -1)
        var->SetBlockSelection(GetMsg->BlockID);
    if (GetMsg->Start)
    {
        Box<Dims> b;
        if (GetMsg->Count)
        {
            for (int i = 0; i < GetMsg->DimCount; i++)
            {
                b.first.push_back(GetMsg->Start[i]);
                b.second.push_back(GetMsg->Count[i]);
            }
        }
        var->SetSelection(b);
    }
    std::cout << "Reading var " << VarName << " with "
              << (GetMsg->Relative ? "relative" : "absolute") << " error " << GetMsg->Error
              << " in norm " << GetMsg->Norm << std::endl;
    size_t readSize = var->SelectionSize() * sizeof(T);
    T *RawData = (T *)malloc(readSize);
    f->m_engine->Get(*var, RawData, Mode::Sync);

    WaitForAvailableThread(); /* blocking here until we can launch a thread */

    // Handle returning data in a separate thread so that we can serve another read operation in the
    // meantime. Compress data if possible and if requested.
    // Note: Can't pass Variable object to thread as other response will modify its content
    Accuracy acc = {GetMsg->Error, GetMsg->Norm, (bool)GetMsg->Relative};
    std::thread{ReturnResponseThread<T>,
                conn,
                ev_state->ReadResponseFormat,
                f,
                readSize,
                RawData,
                GetMsg->Dest,
                GetMsg->GetResponseCondition,
                acc,
                var->m_Name,
                var->m_Type,
                var->m_StepsStart,
                var->m_StepsCount,
                var->Count(), // function, not m_Count is correct for block selections
                var->m_Start,
                var->m_BlockID,
                (var->m_SelectionType == SelectionType::BoundingBox)}
        .detach();
    return;
}